

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O2

Emitter * __thiscall YAML::Emitter::Write(Emitter *this,_Null *param_1)

{
  char *pcVar1;
  size_t in_RCX;
  void *__buf;
  allocator local_31;
  string local_30 [32];
  
  if (((this->m_pState)._M_t.
       super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
       super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
       super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl)->m_isGood == true) {
    PrepareNode(this,Scalar);
    pcVar1 = ComputeNullName(this);
    std::__cxx11::string::string(local_30,pcVar1,&local_31);
    ostream_wrapper::write(&this->m_stream,(int)local_30,__buf,in_RCX);
    std::__cxx11::string::~string(local_30);
    StartedScalar(this);
  }
  return this;
}

Assistant:

Emitter& Emitter::Write(const _Null& /*null*/) {
  if (!good())
    return *this;

  PrepareNode(EmitterNodeType::Scalar);

  m_stream << ComputeNullName();

  StartedScalar();

  return *this;
}